

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::IntToDescriptor
          (ChLinkRevoluteTranslational *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,
          uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  
  uVar3 = (ulong)off_L;
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar4 == '\0') {
    return;
  }
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar3 < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar5 = (ulong)(off_L + 1);
    (this->m_cnstr_par1).super_ChConstraintTwo.super_ChConstraint.l_i = pdVar2[uVar3];
    if (uVar5 < uVar1) {
      uVar6 = (ulong)(off_L + 2);
      (this->m_cnstr_par2).super_ChConstraintTwo.super_ChConstraint.l_i = pdVar2[uVar5];
      if (uVar6 < uVar1) {
        uVar7 = (ulong)(off_L + 3);
        (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i = pdVar2[uVar6];
        if (uVar7 < uVar1) {
          (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.l_i = pdVar2[uVar7];
          uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
          if ((long)uVar3 < (long)uVar1) {
            pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            (this->m_cnstr_par1).super_ChConstraintTwo.super_ChConstraint.b_i = pdVar2[uVar3];
            if (((uVar5 < uVar1) &&
                ((this->m_cnstr_par2).super_ChConstraintTwo.super_ChConstraint.b_i = pdVar2[uVar5],
                uVar6 < uVar1)) &&
               ((this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i = pdVar2[uVar6],
               uVar7 < uVar1)) {
              (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i = pdVar2[uVar7];
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkRevoluteTranslational::IntToDescriptor(const unsigned int off_v,
                                                  const ChStateDelta& v,
                                                  const ChVectorDynamic<>& R,
                                                  const unsigned int off_L,
                                                  const ChVectorDynamic<>& L,
                                                  const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    m_cnstr_par1.Set_l_i(L(off_L + 0));
    m_cnstr_par2.Set_l_i(L(off_L + 1));
    m_cnstr_dot.Set_l_i(L(off_L + 2));
    m_cnstr_dist.Set_l_i(L(off_L + 3));

    m_cnstr_par1.Set_b_i(Qc(off_L + 0));
    m_cnstr_par2.Set_b_i(Qc(off_L + 1));
    m_cnstr_dot.Set_b_i(Qc(off_L + 2));
    m_cnstr_dist.Set_b_i(Qc(off_L + 3));
}